

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void nodeDeleteCell(Rtree *pRtree,RtreeNode *pNode,int iCell)

{
  byte bVar1;
  byte bVar2;
  u8 *puVar3;
  int iVar4;
  int nByte;
  u8 *pSrc;
  u8 *pDst;
  int iCell_local;
  RtreeNode *pNode_local;
  Rtree *pRtree_local;
  
  puVar3 = pNode->zData;
  bVar1 = pRtree->nBytesPerCell;
  bVar2 = pRtree->nBytesPerCell;
  iVar4 = readInt16(pNode->zData + 2);
  memmove(puVar3 + (int)((uint)bVar1 * iCell + 4),puVar3 + (int)((uint)bVar1 * iCell + 4) + bVar2,
          (long)(int)(((iVar4 - iCell) + -1) * (uint)pRtree->nBytesPerCell));
  puVar3 = pNode->zData;
  iVar4 = readInt16(pNode->zData + 2);
  writeInt16(puVar3 + 2,iVar4 + -1);
  pNode->isDirty = 1;
  return;
}

Assistant:

static void nodeDeleteCell(Rtree *pRtree, RtreeNode *pNode, int iCell){
  u8 *pDst = &pNode->zData[4 + pRtree->nBytesPerCell*iCell];
  u8 *pSrc = &pDst[pRtree->nBytesPerCell];
  int nByte = (NCELL(pNode) - iCell - 1) * pRtree->nBytesPerCell;
  memmove(pDst, pSrc, nByte);
  writeInt16(&pNode->zData[2], NCELL(pNode)-1);
  pNode->isDirty = 1;
}